

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWRepository.cxx
# Opt level: O0

bool __thiscall cmCPackIFWRepository::PatchUpdatesXml(cmCPackIFWRepository *this)

{
  bool bVar1;
  ulong uVar2;
  char *file;
  undefined1 local_340 [8];
  cmCPackeIFWUpdatesPatcher patcher;
  cmXMLWriter xout;
  cmGeneratedFileStream fout;
  undefined1 local_50 [8];
  string updatesPatchXml;
  string updatesXml;
  cmCPackIFWRepository *this_local;
  
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) != 0) && ((this->super_cmCPackIFWCommon).Generator != (cmCPackIFWGenerator *)0x0)
     ) {
    std::__cxx11::string::operator=
              ((string *)&this->Directory,
               (string *)
               &(((this->super_cmCPackIFWCommon).Generator)->super_cmCPackGenerator).toplevel);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&updatesPatchXml.field_2 + 8),&this->Directory,"/repository/Updates.xml");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 &this->Directory,"/repository/UpdatesPatch.xml");
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)&xout.ElementOpen,(string *)local_50,false,None);
  cmXMLWriter::cmXMLWriter((cmXMLWriter *)&patcher.patched,(ostream *)&xout.ElementOpen,0);
  cmXMLWriter::StartDocument((cmXMLWriter *)&patcher.patched,"UTF-8");
  cmCPackIFWCommon::WriteGeneratedByToStrim
            (&this->super_cmCPackIFWCommon,(cmXMLWriter *)&patcher.patched);
  cmCPackeIFWUpdatesPatcher::cmCPackeIFWUpdatesPatcher
            ((cmCPackeIFWUpdatesPatcher *)local_340,this,(cmXMLWriter *)&patcher.patched);
  file = (char *)std::__cxx11::string::data();
  cmXMLParser::ParseFile((cmXMLParser *)local_340,file);
  cmCPackeIFWUpdatesPatcher::~cmCPackeIFWUpdatesPatcher((cmCPackeIFWUpdatesPatcher *)local_340);
  cmXMLWriter::EndDocument((cmXMLWriter *)&patcher.patched);
  cmGeneratedFileStream::Close((cmGeneratedFileStream *)&xout.ElementOpen);
  bVar1 = cmSystemTools::RenameFile
                    ((string *)local_50,(string *)((long)&updatesPatchXml.field_2 + 8));
  cmXMLWriter::~cmXMLWriter((cmXMLWriter *)&patcher.patched);
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&xout.ElementOpen);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)(updatesPatchXml.field_2._M_local_buf + 8));
  return bVar1;
}

Assistant:

bool cmCPackIFWRepository::PatchUpdatesXml()
{
  // Lazy directory initialization
  if (this->Directory.empty() && this->Generator) {
    this->Directory = this->Generator->toplevel;
  }

  // Filenames
  std::string updatesXml = this->Directory + "/repository/Updates.xml";
  std::string updatesPatchXml =
    this->Directory + "/repository/UpdatesPatch.xml";

  // Output stream
  cmGeneratedFileStream fout(updatesPatchXml);
  cmXMLWriter xout(fout);

  xout.StartDocument();

  this->WriteGeneratedByToStrim(xout);

  // Patch
  {
    cmCPackeIFWUpdatesPatcher patcher(this, xout);
    patcher.ParseFile(updatesXml.data());
  }

  xout.EndDocument();

  fout.Close();

  return cmSystemTools::RenameFile(updatesPatchXml, updatesXml);
}